

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::doPendingFuntors(EventLoop *this)

{
  _Any_data *p_Var1;
  undefined8 uVar2;
  _Any_data *p_Var3;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_40;
  
  this->callingPendingFunctors_ = true;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  p_Var3 = (_Any_data *)
           (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Any_data *)
           (this->pendingFuntors_).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->pendingFuntors_).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pendingFuntors_).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)p_Var3;
  local_40.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  while( true ) {
    if (p_Var3 == p_Var1) {
      this->callingPendingFunctors_ = false;
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                (&local_40);
      return;
    }
    if (*(long *)(p_Var3 + 1) == 0) break;
    (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3);
    p_Var3 = p_Var3 + 2;
  }
  uVar2 = std::__throw_bad_function_call();
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_40);
  _Unwind_Resume(uVar2);
}

Assistant:

void EventLoop::doPendingFuntors() {
    std::vector<Functor> functors;
    callingPendingFunctors_ = true;
    
    {
        MutexLockGuard lock(mutex_);
        functors.swap(pendingFuntors_);
    }

    for(const Functor& functor : functors) {
        functor();
    }

    callingPendingFunctors_ = false;
}